

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

uint __thiscall
wasm::Visitor<wasm::CostAnalyzer,_unsigned_int>::visit
          (Visitor<wasm::CostAnalyzer,_unsigned_int> *this,Expression *curr)

{
  Expression *curr_local;
  Visitor<wasm::CostAnalyzer,_unsigned_int> *this_local;
  
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      this_local._4_4_ = CostAnalyzer::visitBlock((CostAnalyzer *)this,(Block *)curr);
      break;
    case IfId:
      this_local._4_4_ = CostAnalyzer::visitIf((CostAnalyzer *)this,(If *)curr);
      break;
    case LoopId:
      this_local._4_4_ = CostAnalyzer::visitLoop((CostAnalyzer *)this,(Loop *)curr);
      break;
    case BreakId:
      this_local._4_4_ = CostAnalyzer::visitBreak((CostAnalyzer *)this,(Break *)curr);
      break;
    case SwitchId:
      this_local._4_4_ = CostAnalyzer::visitSwitch((CostAnalyzer *)this,(Switch *)curr);
      break;
    case CallId:
      this_local._4_4_ = CostAnalyzer::visitCall((CostAnalyzer *)this,(Call *)curr);
      break;
    case CallIndirectId:
      this_local._4_4_ = CostAnalyzer::visitCallIndirect((CostAnalyzer *)this,(CallIndirect *)curr);
      break;
    case LocalGetId:
      this_local._4_4_ = CostAnalyzer::visitLocalGet((CostAnalyzer *)this,(LocalGet *)curr);
      break;
    case LocalSetId:
      this_local._4_4_ = CostAnalyzer::visitLocalSet((CostAnalyzer *)this,(LocalSet *)curr);
      break;
    case GlobalGetId:
      this_local._4_4_ = CostAnalyzer::visitGlobalGet((CostAnalyzer *)this,(GlobalGet *)curr);
      break;
    case GlobalSetId:
      this_local._4_4_ = CostAnalyzer::visitGlobalSet((CostAnalyzer *)this,(GlobalSet *)curr);
      break;
    case LoadId:
      this_local._4_4_ = CostAnalyzer::visitLoad((CostAnalyzer *)this,(Load *)curr);
      break;
    case StoreId:
      this_local._4_4_ = CostAnalyzer::visitStore((CostAnalyzer *)this,(Store *)curr);
      break;
    case ConstId:
      this_local._4_4_ = CostAnalyzer::visitConst((CostAnalyzer *)this,(Const *)curr);
      break;
    case UnaryId:
      this_local._4_4_ = CostAnalyzer::visitUnary((CostAnalyzer *)this,(Unary *)curr);
      break;
    case BinaryId:
      this_local._4_4_ = CostAnalyzer::visitBinary((CostAnalyzer *)this,(Binary *)curr);
      break;
    case SelectId:
      this_local._4_4_ = CostAnalyzer::visitSelect((CostAnalyzer *)this,(Select *)curr);
      break;
    case DropId:
      this_local._4_4_ = CostAnalyzer::visitDrop((CostAnalyzer *)this,(Drop *)curr);
      break;
    case ReturnId:
      this_local._4_4_ = CostAnalyzer::visitReturn((CostAnalyzer *)this,(Return *)curr);
      break;
    case MemorySizeId:
      this_local._4_4_ = CostAnalyzer::visitMemorySize((CostAnalyzer *)this,(MemorySize *)curr);
      break;
    case MemoryGrowId:
      this_local._4_4_ = CostAnalyzer::visitMemoryGrow((CostAnalyzer *)this,(MemoryGrow *)curr);
      break;
    case NopId:
      this_local._4_4_ = CostAnalyzer::visitNop((CostAnalyzer *)this,(Nop *)curr);
      break;
    case UnreachableId:
      this_local._4_4_ = CostAnalyzer::visitUnreachable((CostAnalyzer *)this,(Unreachable *)curr);
      break;
    case AtomicRMWId:
      this_local._4_4_ = CostAnalyzer::visitAtomicRMW((CostAnalyzer *)this,(AtomicRMW *)curr);
      break;
    case AtomicCmpxchgId:
      this_local._4_4_ =
           CostAnalyzer::visitAtomicCmpxchg((CostAnalyzer *)this,(AtomicCmpxchg *)curr);
      break;
    case AtomicWaitId:
      this_local._4_4_ = CostAnalyzer::visitAtomicWait((CostAnalyzer *)this,(AtomicWait *)curr);
      break;
    case AtomicNotifyId:
      this_local._4_4_ = CostAnalyzer::visitAtomicNotify((CostAnalyzer *)this,(AtomicNotify *)curr);
      break;
    case AtomicFenceId:
      this_local._4_4_ = CostAnalyzer::visitAtomicFence((CostAnalyzer *)this,(AtomicFence *)curr);
      break;
    case SIMDExtractId:
      this_local._4_4_ = CostAnalyzer::visitSIMDExtract((CostAnalyzer *)this,(SIMDExtract *)curr);
      break;
    case SIMDReplaceId:
      this_local._4_4_ = CostAnalyzer::visitSIMDReplace((CostAnalyzer *)this,(SIMDReplace *)curr);
      break;
    case SIMDShuffleId:
      this_local._4_4_ = CostAnalyzer::visitSIMDShuffle((CostAnalyzer *)this,(SIMDShuffle *)curr);
      break;
    case SIMDTernaryId:
      this_local._4_4_ = CostAnalyzer::visitSIMDTernary((CostAnalyzer *)this,(SIMDTernary *)curr);
      break;
    case SIMDShiftId:
      this_local._4_4_ = CostAnalyzer::visitSIMDShift((CostAnalyzer *)this,(SIMDShift *)curr);
      break;
    case SIMDLoadId:
      this_local._4_4_ = CostAnalyzer::visitSIMDLoad((CostAnalyzer *)this,(SIMDLoad *)curr);
      break;
    case SIMDLoadStoreLaneId:
      this_local._4_4_ =
           CostAnalyzer::visitSIMDLoadStoreLane((CostAnalyzer *)this,(SIMDLoadStoreLane *)curr);
      break;
    case MemoryInitId:
      this_local._4_4_ = CostAnalyzer::visitMemoryInit((CostAnalyzer *)this,(MemoryInit *)curr);
      break;
    case DataDropId:
      this_local._4_4_ = CostAnalyzer::visitDataDrop((CostAnalyzer *)this,(DataDrop *)curr);
      break;
    case MemoryCopyId:
      this_local._4_4_ = CostAnalyzer::visitMemoryCopy((CostAnalyzer *)this,(MemoryCopy *)curr);
      break;
    case MemoryFillId:
      this_local._4_4_ = CostAnalyzer::visitMemoryFill((CostAnalyzer *)this,(MemoryFill *)curr);
      break;
    case PopId:
      this_local._4_4_ = CostAnalyzer::visitPop((CostAnalyzer *)this,(Pop *)curr);
      break;
    case RefNullId:
      this_local._4_4_ = CostAnalyzer::visitRefNull((CostAnalyzer *)this,(RefNull *)curr);
      break;
    case RefIsNullId:
      this_local._4_4_ = CostAnalyzer::visitRefIsNull((CostAnalyzer *)this,(RefIsNull *)curr);
      break;
    case RefFuncId:
      this_local._4_4_ = CostAnalyzer::visitRefFunc((CostAnalyzer *)this,(RefFunc *)curr);
      break;
    case RefEqId:
      this_local._4_4_ = CostAnalyzer::visitRefEq((CostAnalyzer *)this,(RefEq *)curr);
      break;
    case TableGetId:
      this_local._4_4_ = CostAnalyzer::visitTableGet((CostAnalyzer *)this,(TableGet *)curr);
      break;
    case TableSetId:
      this_local._4_4_ = CostAnalyzer::visitTableSet((CostAnalyzer *)this,(TableSet *)curr);
      break;
    case TableSizeId:
      this_local._4_4_ = CostAnalyzer::visitTableSize((CostAnalyzer *)this,(TableSize *)curr);
      break;
    case TableGrowId:
      this_local._4_4_ = CostAnalyzer::visitTableGrow((CostAnalyzer *)this,(TableGrow *)curr);
      break;
    case TableFillId:
      this_local._4_4_ = CostAnalyzer::visitTableFill((CostAnalyzer *)this,(TableFill *)curr);
      break;
    case TableCopyId:
      this_local._4_4_ = CostAnalyzer::visitTableCopy((CostAnalyzer *)this,(TableCopy *)curr);
      break;
    case TableInitId:
      this_local._4_4_ = CostAnalyzer::visitTableInit((CostAnalyzer *)this,(TableInit *)curr);
      break;
    case TryId:
      this_local._4_4_ = CostAnalyzer::visitTry((CostAnalyzer *)this,(Try *)curr);
      break;
    case TryTableId:
      this_local._4_4_ = CostAnalyzer::visitTryTable((CostAnalyzer *)this,(TryTable *)curr);
      break;
    case ThrowId:
      this_local._4_4_ = CostAnalyzer::visitThrow((CostAnalyzer *)this,(Throw *)curr);
      break;
    case RethrowId:
      this_local._4_4_ = CostAnalyzer::visitRethrow((CostAnalyzer *)this,(Rethrow *)curr);
      break;
    case ThrowRefId:
      this_local._4_4_ = CostAnalyzer::visitThrowRef((CostAnalyzer *)this,(ThrowRef *)curr);
      break;
    case TupleMakeId:
      this_local._4_4_ = CostAnalyzer::visitTupleMake((CostAnalyzer *)this,(TupleMake *)curr);
      break;
    case TupleExtractId:
      this_local._4_4_ = CostAnalyzer::visitTupleExtract((CostAnalyzer *)this,(TupleExtract *)curr);
      break;
    case RefI31Id:
      this_local._4_4_ = CostAnalyzer::visitRefI31((CostAnalyzer *)this,(RefI31 *)curr);
      break;
    case I31GetId:
      this_local._4_4_ = CostAnalyzer::visitI31Get((CostAnalyzer *)this,(I31Get *)curr);
      break;
    case CallRefId:
      this_local._4_4_ = CostAnalyzer::visitCallRef((CostAnalyzer *)this,(CallRef *)curr);
      break;
    case RefTestId:
      this_local._4_4_ = CostAnalyzer::visitRefTest((CostAnalyzer *)this,(RefTest *)curr);
      break;
    case RefCastId:
      this_local._4_4_ = CostAnalyzer::visitRefCast((CostAnalyzer *)this,(RefCast *)curr);
      break;
    case BrOnId:
      this_local._4_4_ = CostAnalyzer::visitBrOn((CostAnalyzer *)this,(BrOn *)curr);
      break;
    case StructNewId:
      this_local._4_4_ = CostAnalyzer::visitStructNew((CostAnalyzer *)this,(StructNew *)curr);
      break;
    case StructGetId:
      this_local._4_4_ = CostAnalyzer::visitStructGet((CostAnalyzer *)this,(StructGet *)curr);
      break;
    case StructSetId:
      this_local._4_4_ = CostAnalyzer::visitStructSet((CostAnalyzer *)this,(StructSet *)curr);
      break;
    case StructRMWId:
      this_local._4_4_ = CostAnalyzer::visitStructRMW((CostAnalyzer *)this,(StructRMW *)curr);
      break;
    case StructCmpxchgId:
      this_local._4_4_ =
           CostAnalyzer::visitStructCmpxchg((CostAnalyzer *)this,(StructCmpxchg *)curr);
      break;
    case ArrayNewId:
      this_local._4_4_ = CostAnalyzer::visitArrayNew((CostAnalyzer *)this,(ArrayNew *)curr);
      break;
    case ArrayNewDataId:
      this_local._4_4_ = CostAnalyzer::visitArrayNewData((CostAnalyzer *)this,(ArrayNewData *)curr);
      break;
    case ArrayNewElemId:
      this_local._4_4_ = CostAnalyzer::visitArrayNewElem((CostAnalyzer *)this,(ArrayNewElem *)curr);
      break;
    case ArrayNewFixedId:
      this_local._4_4_ =
           CostAnalyzer::visitArrayNewFixed((CostAnalyzer *)this,(ArrayNewFixed *)curr);
      break;
    case ArrayGetId:
      this_local._4_4_ = CostAnalyzer::visitArrayGet((CostAnalyzer *)this,(ArrayGet *)curr);
      break;
    case ArraySetId:
      this_local._4_4_ = CostAnalyzer::visitArraySet((CostAnalyzer *)this,(ArraySet *)curr);
      break;
    case ArrayLenId:
      this_local._4_4_ = CostAnalyzer::visitArrayLen((CostAnalyzer *)this,(ArrayLen *)curr);
      break;
    case ArrayCopyId:
      this_local._4_4_ = CostAnalyzer::visitArrayCopy((CostAnalyzer *)this,(ArrayCopy *)curr);
      break;
    case ArrayFillId:
      this_local._4_4_ = CostAnalyzer::visitArrayFill((CostAnalyzer *)this,(ArrayFill *)curr);
      break;
    case ArrayInitDataId:
      this_local._4_4_ =
           CostAnalyzer::visitArrayInitData((CostAnalyzer *)this,(ArrayInitData *)curr);
      break;
    case ArrayInitElemId:
      this_local._4_4_ =
           CostAnalyzer::visitArrayInitElem((CostAnalyzer *)this,(ArrayInitElem *)curr);
      break;
    case RefAsId:
      this_local._4_4_ = CostAnalyzer::visitRefAs((CostAnalyzer *)this,(RefAs *)curr);
      break;
    case StringNewId:
      this_local._4_4_ = CostAnalyzer::visitStringNew((CostAnalyzer *)this,(StringNew *)curr);
      break;
    case StringConstId:
      this_local._4_4_ = CostAnalyzer::visitStringConst((CostAnalyzer *)this,(StringConst *)curr);
      break;
    case StringMeasureId:
      this_local._4_4_ =
           CostAnalyzer::visitStringMeasure((CostAnalyzer *)this,(StringMeasure *)curr);
      break;
    case StringEncodeId:
      this_local._4_4_ = CostAnalyzer::visitStringEncode((CostAnalyzer *)this,(StringEncode *)curr);
      break;
    case StringConcatId:
      this_local._4_4_ = CostAnalyzer::visitStringConcat((CostAnalyzer *)this,(StringConcat *)curr);
      break;
    case StringEqId:
      this_local._4_4_ = CostAnalyzer::visitStringEq((CostAnalyzer *)this,(StringEq *)curr);
      break;
    case StringWTF16GetId:
      this_local._4_4_ =
           CostAnalyzer::visitStringWTF16Get((CostAnalyzer *)this,(StringWTF16Get *)curr);
      break;
    case StringSliceWTFId:
      this_local._4_4_ =
           CostAnalyzer::visitStringSliceWTF((CostAnalyzer *)this,(StringSliceWTF *)curr);
      break;
    case ContNewId:
      this_local._4_4_ = CostAnalyzer::visitContNew((CostAnalyzer *)this,(ContNew *)curr);
      break;
    case ContBindId:
      this_local._4_4_ = CostAnalyzer::visitContBind((CostAnalyzer *)this,(ContBind *)curr);
      break;
    case SuspendId:
      this_local._4_4_ = CostAnalyzer::visitSuspend((CostAnalyzer *)this,(Suspend *)curr);
      break;
    case ResumeId:
      this_local._4_4_ = CostAnalyzer::visitResume((CostAnalyzer *)this,(Resume *)curr);
      break;
    case ResumeThrowId:
      this_local._4_4_ = CostAnalyzer::visitResumeThrow((CostAnalyzer *)this,(ResumeThrow *)curr);
      break;
    case StackSwitchId:
      this_local._4_4_ = CostAnalyzer::visitStackSwitch((CostAnalyzer *)this,(StackSwitch *)curr);
      break;
    default:
      handle_unreachable("unexpected expression type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                         ,0x46);
    }
    return this_local._4_4_;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::CostAnalyzer, unsigned int>::visit(Expression *) [SubType = wasm::CostAnalyzer, ReturnType = unsigned int]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }